

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void TElasticity3DAnalytic::ElasticDummy
               (TPZVec<double> *x,TPZVec<double> *result,TPZFMatrix<double> *deriv)

{
  double *pdVar1;
  long lVar2;
  TPZManVector<double,_10> xstate;
  TPZManVector<double,_10> TStack_88;
  
  TPZManVector<double,_10>::TPZManVector(&TStack_88,x->fNElements);
  if (0 < TStack_88.super_TPZVec<double>.fNElements) {
    pdVar1 = x->fStore;
    lVar2 = 0;
    do {
      TStack_88.super_TPZVec<double>.fStore[lVar2] = pdVar1[lVar2];
      lVar2 = lVar2 + 1;
    } while (TStack_88.super_TPZVec<double>.fNElements != lVar2);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0x435);
}

Assistant:

void TElasticity3DAnalytic::ElasticDummy(const TPZVec<REAL> &x, TPZVec<STATE> &result, TPZFMatrix<STATE> &deriv)
{
    TPZManVector<STATE> xstate(x.size());
    for (int i=0; i<xstate.size(); i++) {
        xstate[i] = x[i];
    }
    STATE E = 1.,nu = 0.3;
    DebugStop();
//    Elastic(xstate,E,nu);
    result[0] = E;
    result[1] = nu;
}